

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  size_t _elemsize;
  _func_int **pp_Var1;
  int *piVar2;
  Mat *pMVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar10;
  float *pfVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  _func_int *p_Var11;
  Option *opt_00;
  long lVar12;
  int iVar14;
  ulong uVar13;
  Pooling *this_00;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  void *pvVar20;
  int iVar21;
  uint _w;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  __m128 _inv_maxk;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_128;
  allocator_type local_109;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  void *local_e0;
  Mat local_d8;
  _func_int **local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  this_00 = (Pooling *)((long)&this->_vptr_Pooling_x86 + (long)this->_vptr_Pooling_x86[-3]);
  if ((*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86[-3]) != 0) ||
     (bottom_blob->elempack != 4)) {
    iVar4 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar4;
  }
  _c = bottom_blob->c;
  uVar13 = (ulong)_c;
  _elemsize = bottom_blob->elemsize;
  if (this_00->global_pooling != 0) {
    iVar4 = bottom_blob->w;
    iVar21 = bottom_blob->h;
    Mat::create(top_blob,_c,_elemsize,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar21 = iVar21 * iVar4;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) == 0) {
      if ((int)_c < 1) {
        return 0;
      }
      uVar6 = 0;
      do {
        lVar12 = bottom_blob->cstep * uVar6 * bottom_blob->elemsize;
        auVar26 = *(undefined1 (*) [16])((long)bottom_blob->data + lVar12);
        if (0 < iVar21) {
          pauVar8 = (undefined1 (*) [16])((long)bottom_blob->data + lVar12);
          iVar4 = iVar21;
          do {
            auVar26 = maxps(auVar26,*pauVar8);
            pauVar8 = pauVar8 + 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar6 * 0x10) = auVar26;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar13);
    }
    else {
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86[-3]) != 1) {
        return 0;
      }
      if ((int)_c < 1) {
        return 0;
      }
      fVar25 = 1.0 / (float)iVar21;
      uVar6 = 0;
      do {
        if (iVar21 < 1) {
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          fVar30 = 0.0;
        }
        else {
          pfVar7 = (float *)(bottom_blob->cstep * uVar6 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          fVar27 = 0.0;
          fVar28 = 0.0;
          fVar29 = 0.0;
          fVar30 = 0.0;
          iVar4 = iVar21;
          do {
            fVar27 = fVar27 + *pfVar7;
            fVar28 = fVar28 + pfVar7[1];
            fVar29 = fVar29 + pfVar7[2];
            fVar30 = fVar30 + pfVar7[3];
            pfVar7 = pfVar7 + 4;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        pfVar7 = (float *)((long)top_blob->data + uVar6 * 0x10);
        *pfVar7 = fVar27 * fVar25;
        pfVar7[1] = fVar28 * fVar25;
        pfVar7[2] = fVar29 * fVar25;
        pfVar7[3] = fVar30 * fVar25;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar13);
    }
    return 0;
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  local_108 = top_blob;
  Pooling::make_padding(this_00,bottom_blob,&local_d8,opt);
  iVar21 = local_d8.h;
  iVar4 = local_d8.w;
  pMVar3 = local_108;
  iVar5 = -100;
  if ((local_d8.data == (void *)0x0) || ((long)local_d8.c * local_d8.cstep == 0)) goto LAB_0032f25c;
  p_Var11 = this->_vptr_Pooling_x86[-3];
  uVar6 = (long)(local_d8.w - *(int *)(&this->field_0xd4 + (long)p_Var11)) /
          (long)*(int *)(&this->field_0xdc + (long)p_Var11);
  local_e8 = uVar6 & 0xffffffff;
  uVar22 = (long)(local_d8.h - *(int *)(&this->field_0xd8 + (long)p_Var11)) /
           (long)*(int *)(&this->field_0xe0 + (long)p_Var11);
  local_100 = uVar22 & 0xffffffff;
  _w = (int)uVar6 + 1;
  Mat::create(local_108,_w,(int)uVar22 + 1,_c,_elemsize,4,opt->blob_allocator);
  iVar5 = -100;
  if ((pMVar3->data == (void *)0x0) || ((long)pMVar3->c * pMVar3->cstep == 0)) goto LAB_0032f25c;
  uVar6 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86[-3]) *
          (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86[-3]);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar6,&local_109);
  pp_Var1 = this->_vptr_Pooling_x86;
  p_Var11 = pp_Var1[-3];
  iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var11);
  if (0 < iVar5) {
    iVar10 = *(int *)(&this->field_0xd4 + (long)p_Var11);
    iVar14 = 0;
    iVar17 = 0;
    iVar19 = 0;
    do {
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var11)) {
        lVar12 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar17 + lVar12] = iVar19 + (int)lVar12;
          p_Var11 = pp_Var1[-3];
          lVar12 = lVar12 + 1;
          iVar5 = (int)lVar12;
        } while (iVar5 < *(int *)(&this->field_0xd4 + (long)p_Var11));
        iVar17 = iVar17 + iVar5;
        iVar19 = iVar19 + iVar5;
      }
      iVar19 = iVar19 + (iVar4 - iVar10);
      iVar14 = iVar14 + 1;
      iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var11);
    } while (iVar14 < iVar5);
  }
  opt_00 = (Option *)((long)&this->_vptr_Pooling_x86 + (long)p_Var11);
  iVar10 = (int)uVar6;
  if (*(int *)&opt_00[3].workspace_allocator == 0) {
    iVar4 = *(int *)((long)&opt_00[3].workspace_allocator + 4);
    if ((iVar5 == 2) && (iVar4 == 2)) {
      iVar5._0_1_ = opt_00[3].use_winograd_convolution;
      iVar5._1_1_ = opt_00[3].use_sgemm_convolution;
      iVar5._2_1_ = opt_00[3].use_int8_inference;
      iVar5._3_1_ = opt_00[3].use_vulkan_compute;
      if ((iVar5 == 2) &&
         (iVar14._0_1_ = opt_00[3].use_bf16_storage, iVar14._1_1_ = opt_00[3].use_fp16_packed,
         iVar14._2_1_ = opt_00[3].use_fp16_storage, iVar14._3_1_ = opt_00[3].use_fp16_arithmetic,
         iVar14 == 2)) {
        pooling2x2s2_max_pack4_sse(&local_d8,local_108,opt_00);
      }
      else {
LAB_0032ee63:
        if (0 < (int)_c) {
          local_128 = 0;
          do {
            if (-1 < (int)local_100) {
              pvVar20 = (void *)(local_108->cstep * local_128 * local_108->elemsize +
                                (long)local_108->data);
              pp_Var1 = this->_vptr_Pooling_x86;
              iVar4 = 0;
              do {
                if (-1 < (int)local_e8) {
                  uVar22 = 0;
                  do {
                    lVar12 = (long)*(int *)(&this->field_0xe0 + (long)pp_Var1[-3]) * (long)iVar4 *
                             (long)local_d8.w *
                             CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                             local_d8.cstep * local_128 *
                             CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
                    lVar16 = (long)(*(int *)(&this->field_0xdc + (long)pp_Var1[-3]) * (int)uVar22 *
                                   4);
                    auVar26 = *(undefined1 (*) [16])((long)local_d8.data + lVar16 * 4 + lVar12);
                    if (0 < iVar10) {
                      uVar15 = 0;
                      do {
                        auVar26 = maxps(auVar26,*(undefined1 (*) [16])
                                                 ((long)local_d8.data +
                                                 (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar15] *
                                                 0x10 + lVar16 * 4 + lVar12));
                        uVar15 = uVar15 + 1;
                      } while ((uVar6 & 0xffffffff) != uVar15);
                    }
                    *(undefined1 (*) [16])((long)pvVar20 + uVar22 * 0x10) = auVar26;
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != _w);
                }
                pvVar20 = (void *)((long)pvVar20 + (long)(int)(_w * 4) * 4);
                bVar24 = iVar4 != (int)local_100;
                iVar4 = iVar4 + 1;
              } while (bVar24);
            }
            local_128 = local_128 + 1;
          } while (local_128 != uVar13);
        }
      }
    }
    else {
      if ((iVar5 != 3) ||
         (((iVar4 != 3 ||
           (iVar4._0_1_ = opt_00[3].use_winograd_convolution,
           iVar4._1_1_ = opt_00[3].use_sgemm_convolution, iVar4._2_1_ = opt_00[3].use_int8_inference
           , iVar4._3_1_ = opt_00[3].use_vulkan_compute, iVar4 != 2)) ||
          (iVar21._0_1_ = opt_00[3].use_bf16_storage, iVar21._1_1_ = opt_00[3].use_fp16_packed,
          iVar21._2_1_ = opt_00[3].use_fp16_storage, iVar21._3_1_ = opt_00[3].use_fp16_arithmetic,
          iVar21 != 2)))) goto LAB_0032ee63;
      pooling3x3s2_max_pack4_sse(&local_d8,local_108,opt_00);
    }
  }
  else if (*(int *)&opt_00[3].workspace_allocator == 1) {
    iVar17._0_1_ = opt_00[3].use_reserved_8;
    iVar17._1_1_ = opt_00[3].use_reserved_9;
    iVar17._2_1_ = opt_00[3].use_reserved_10;
    iVar17._3_1_ = opt_00[3].use_reserved_11;
    if (iVar17 == 0) {
      iVar14 = 0;
      iVar10._0_1_ = opt_00[3].use_winograd43_convolution;
      iVar10._1_1_ = opt_00[3].use_winograd63_convolution;
      iVar10._2_1_ = opt_00[3].use_reserved_6;
      iVar10._3_1_ = opt_00[3].use_reserved_7;
      iVar5 = 0;
      if (iVar10 == 0) {
        iVar14 = (bottom_blob->w - local_d8.w) + *(int *)&opt_00[3].use_int8_packed +
                 *(int *)&opt_00[3].use_shader_pack8;
        iVar5 = (bottom_blob->h - local_d8.h) + *(int *)&opt_00[3].use_subgroup_shuffle +
                opt_00[3].flush_denormals;
      }
      if (0 < (int)_c) {
        local_90 = this->_vptr_Pooling_x86;
        local_68 = (long)(int)(_w * 4);
        local_58 = (ulong)_w;
        local_f8 = 0;
        do {
          if (-1 < (int)local_100) {
            local_70 = local_d8.data;
            local_78 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
            local_e0 = (void *)(local_108->cstep * local_f8 * local_108->elemsize +
                               (long)local_108->data);
            local_80 = (long)local_d8.w;
            local_88 = local_d8.cstep * local_f8;
            local_f0 = 0;
            do {
              if (-1 < (int)local_e8) {
                lVar12 = (long)(*(int *)(&this->field_0xe0 + (long)local_90[-3]) * (int)local_f0);
                local_60 = (void *)((local_80 * lVar12 + local_88) * local_78 + (long)local_d8.data)
                ;
                uVar6 = 0;
                do {
                  p_Var11 = local_90[-3];
                  if ((long)*(int *)(&this->field_0xd8 + (long)p_Var11) < 1) {
                    fVar30 = 0.0;
                    fVar25 = 0.0;
                    fVar27 = 0.0;
                    fVar28 = 0.0;
                    fVar29 = 0.0;
                  }
                  else {
                    lVar23 = (long)(*(int *)(&this->field_0xdc + (long)p_Var11) * (int)uVar6);
                    pvVar20 = (void *)(lVar23 * 0x10 + (long)local_60);
                    fVar25 = 0.0;
                    fVar27 = 0.0;
                    fVar28 = 0.0;
                    fVar29 = 0.0;
                    lVar16 = 0;
                    iVar10 = 0;
                    do {
                      lVar18 = lVar16 + lVar12;
                      if (*(int *)(&this->field_0xec + (long)p_Var11) <= lVar18) {
                        if ((iVar5 + iVar21) - *(int *)(&this->field_0xf0 + (long)p_Var11) <= lVar18
                           ) break;
                        if (0 < (long)*(int *)(&this->field_0xd4 + (long)p_Var11)) {
                          lVar9 = 0;
                          lVar18 = lVar23;
                          do {
                            if (*(int *)(&this->field_0xe4 + (long)p_Var11) <= lVar18) {
                              if ((iVar14 + iVar4) - *(int *)(&this->field_0xe8 + (long)p_Var11) <=
                                  lVar18) break;
                              pfVar7 = (float *)((long)pvVar20 + lVar9);
                              fVar25 = fVar25 + *pfVar7;
                              fVar27 = fVar27 + pfVar7[1];
                              fVar28 = fVar28 + pfVar7[2];
                              fVar29 = fVar29 + pfVar7[3];
                              iVar10 = iVar10 + 1;
                            }
                            lVar9 = lVar9 + 0x10;
                            lVar18 = lVar18 + 1;
                          } while ((long)*(int *)(&this->field_0xd4 + (long)p_Var11) * 0x10 != lVar9
                                  );
                        }
                      }
                      lVar16 = lVar16 + 1;
                      pvVar20 = (void *)((long)pvVar20 + local_78 * local_80);
                    } while (lVar16 != *(int *)(&this->field_0xd8 + (long)p_Var11));
                    fVar30 = (float)iVar10;
                    local_50 = uVar6;
                  }
                  fVar30 = 1.0 / fVar30;
                  pfVar7 = (float *)((long)local_e0 + uVar6 * 0x10);
                  *pfVar7 = fVar30 * fVar25;
                  pfVar7[1] = fVar30 * fVar27;
                  pfVar7[2] = fVar30 * fVar28;
                  pfVar7[3] = fVar30 * fVar29;
                  uVar6 = uVar6 + 1;
                } while (uVar6 != local_58);
              }
              local_e0 = (void *)((long)local_e0 + local_68 * 4);
              bVar24 = (int)local_f0 != (int)local_100;
              local_f0 = (ulong)((int)local_f0 + 1);
            } while (bVar24);
          }
          local_f8 = local_f8 + 1;
        } while (local_f8 != uVar13);
      }
    }
    else if (0 < (int)_c) {
      fVar25 = 1.0 / (float)iVar10;
      local_128 = 0;
      do {
        if (-1 < (int)local_100) {
          pvVar20 = (void *)(local_108->cstep * local_128 * local_108->elemsize +
                            (long)local_108->data);
          pp_Var1 = this->_vptr_Pooling_x86;
          iVar4 = 0;
          do {
            if (-1 < (int)local_e8) {
              uVar22 = 0;
              do {
                if (iVar10 < 1) {
                  fVar27 = 0.0;
                  fVar28 = 0.0;
                  fVar29 = 0.0;
                  fVar30 = 0.0;
                }
                else {
                  fVar27 = 0.0;
                  fVar28 = 0.0;
                  fVar29 = 0.0;
                  fVar30 = 0.0;
                  uVar15 = 0;
                  do {
                    pfVar7 = (float *)((long)local_d8.data +
                                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar15] * 0x10
                                      + (long)(*(int *)(&this->field_0xdc + (long)pp_Var1[-3]) *
                                               (int)uVar22 * 4) * 4 +
                                        (long)*(int *)(&this->field_0xe0 + (long)pp_Var1[-3]) *
                                        (long)iVar4 *
                                        (long)local_d8.w *
                                        CONCAT44(local_d8.elemsize._4_4_,
                                                 (undefined4)local_d8.elemsize) +
                                        local_d8.cstep * local_128 *
                                        CONCAT44(local_d8.elemsize._4_4_,
                                                 (undefined4)local_d8.elemsize));
                    fVar27 = fVar27 + *pfVar7;
                    fVar28 = fVar28 + pfVar7[1];
                    fVar29 = fVar29 + pfVar7[2];
                    fVar30 = fVar30 + pfVar7[3];
                    uVar15 = uVar15 + 1;
                  } while ((uVar6 & 0xffffffff) != uVar15);
                }
                pfVar7 = (float *)((long)pvVar20 + uVar22 * 0x10);
                *pfVar7 = fVar27 * fVar25;
                pfVar7[1] = fVar28 * fVar25;
                pfVar7[2] = fVar29 * fVar25;
                pfVar7[3] = fVar30 * fVar25;
                uVar22 = uVar22 + 1;
              } while (uVar22 != _w);
            }
            pvVar20 = (void *)((long)pvVar20 + (long)(int)(_w * 4) * 4);
            bVar24 = iVar4 != (int)local_100;
            iVar4 = iVar4 + 1;
          } while (bVar24);
        }
        local_128 = local_128 + 1;
      } while (local_128 != uVar13);
    }
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar5 = 0;
LAB_0032f25c:
  piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}